

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O1

Boolean MA_set_error_print(Boolean value)

{
  Boolean BVar1;
  
  ma_stats.calls[0x19] = ma_stats.calls[0x19] + 1;
  BVar1 = ma_error_print;
  ma_error_print = value;
  return BVar1;
}

Assistant:

public Boolean MA_set_error_print(Boolean value /* to set flag to */)
{
    Boolean    old_value;    /* of flag */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_set_error_print]++;
#endif /* STATS */

    old_value = ma_error_print;
    ma_error_print = value;
    return old_value;
}